

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O3

char * cht_Morph(player_t *player,PClassPlayerPawn *morphclass,bool quickundo)

{
  APlayerPawn *pAVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar5;
  PClassPlayerPawn *pPVar4;
  
  pAVar1 = player->mo;
  if (pAVar1 == (APlayerPawn *)0x0) {
    return (char *)"";
  }
  pPVar4 = (PClassPlayerPawn *)(pAVar1->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar4 == (PClassPlayerPawn *)0x0) {
    iVar3 = (**(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar1);
    pPVar4 = (PClassPlayerPawn *)CONCAT44(extraout_var,iVar3);
    (pAVar1->super_AActor).super_DThinker.super_DObject.Class = (PClass *)pPVar4;
  }
  iVar3 = (uint)(gameinfo.gametype == GAME_Hexen) * 8 + 4;
  if (player->morphTics == 0) {
    bVar2 = P_MorphPlayer(player,player,morphclass,0,iVar3,(PClassActor *)0x0,(PClassActor *)0x0);
    if (!bVar2) {
      return (char *)"";
    }
    pcVar5 = "TXT_STRANGE";
  }
  else {
    bVar2 = P_UndoPlayerMorph(player,player,0,false);
    if (!bVar2) {
      return (char *)"";
    }
    if ((pPVar4 == morphclass || quickundo) ||
       (bVar2 = P_MorphPlayer(player,player,morphclass,0,iVar3,(PClassActor *)0x0,(PClassActor *)0x0
                             ), !bVar2)) {
      pcVar5 = "TXT_NOTSTRANGE";
    }
    else {
      pcVar5 = "TXT_STRANGER";
    }
  }
  pcVar5 = FStringTable::operator()(&GStrings,pcVar5);
  return pcVar5;
}

Assistant:

const char *cht_Morph (player_t *player, PClassPlayerPawn *morphclass, bool quickundo)
{
	if (player->mo == NULL)
	{
		return "";
	}
	PClassPlayerPawn *oldclass = player->mo->GetClass();

	// Set the standard morph style for the current game
	int style = MORPH_UNDOBYTOMEOFPOWER;
	if (gameinfo.gametype == GAME_Hexen) style |= MORPH_UNDOBYCHAOSDEVICE;

	if (player->morphTics)
	{
		if (P_UndoPlayerMorph (player, player))
		{
			if (!quickundo && oldclass != morphclass && P_MorphPlayer (player, player, morphclass, 0, style))
			{
				return GStrings("TXT_STRANGER");
			}
			return GStrings("TXT_NOTSTRANGE");
		}
	}
	else if (P_MorphPlayer (player, player, morphclass, 0, style))
	{
		return GStrings("TXT_STRANGE");
	}
	return "";
}